

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageImplementation::ImageImplementation
          (ImageImplementation *this,OperationContext *context,Resource *resource,
          VkShaderStageFlagBits stage,string *shaderPrefix,AccessMode mode,PipelineType pipelineType
          ,DispatchCall dispatchCall)

{
  VkImageSubresourceRange *pVVar1;
  VkFormat VVar2;
  VkImageType VVar3;
  OperationContext *context_00;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkDevice device;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  size_t __n;
  Allocation *pAVar4;
  void *pvVar5;
  Resource *pRVar6;
  VkImageView VVar7;
  VkDescriptorSetLayout obj;
  VkDescriptorPool obj_00;
  DeviceInterface *pDVar8;
  GraphicsPipeline *pGVar9;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar10;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar11;
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *this_00;
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *this_01;
  VkPipelineStageFlags VVar12;
  int iVar13;
  uint uVar14;
  TextureFormat format;
  Buffer *this_02;
  Image *pIVar15;
  DescriptorSetLayoutBuilder *pDVar16;
  DescriptorPoolBuilder *pDVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  GraphicsPipeline *this_03;
  ulong uVar19;
  VkImageType viewType;
  VkDescriptorImageInfo srcImageInfo;
  VkDescriptorImageInfo dstImageInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_168;
  Move<vk::Handle<(vk::HandleType)19>_> *local_140;
  Move<vk::Handle<(vk::HandleType)19>_> local_138;
  Move<vk::Handle<(vk::HandleType)22>_> *local_110;
  Move<vk::Handle<(vk::HandleType)21>_> *local_108;
  Move<vk::Handle<(vk::HandleType)13>_> *local_100;
  Move<vk::Handle<(vk::HandleType)13>_> *local_f8;
  VkShaderStageFlagBits local_ec;
  undefined1 local_e8 [20];
  VkImageType VStack_d4;
  undefined8 uStack_d0;
  pointer local_c0;
  pointer local_b8;
  pointer local_a8;
  OperationContext *local_88;
  string *local_80;
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_78
  ;
  MovePtr<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  deUint32 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  deUint32 local_38;
  
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__ImageImplementation_00d66320;
  this->m_context = context;
  this->m_resource = resource;
  this->m_stage = stage;
  local_ec = stage;
  local_88 = context;
  local_80 = shaderPrefix;
  VVar12 = pipelineStageFlagsFromShaderStageFlagBits(stage);
  this->m_pipelineStage = VVar12;
  this->m_mode = mode;
  this->m_dispatchCall = dispatchCall;
  format = ::vk::mapVkFormat((resource->m_imageData).format);
  iVar13 = tcu::getPixelSize(format);
  this->m_hostBufferSizeBytes =
       (ulong)(iVar13 * (resource->m_imageData).extent.width * (resource->m_imageData).extent.height
              * (resource->m_imageData).extent.depth);
  local_78 = &this->m_hostBuffer;
  (this->m_hostBuffer).
  super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>.
  m_data.ptr = (Buffer *)0x0;
  local_70 = &this->m_image;
  (this->m_image).
  super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>.
  m_data.ptr = (Image *)0x0;
  local_f8 = &this->m_srcImageView;
  local_100 = &this->m_dstImageView;
  local_108 = &this->m_descriptorPool;
  local_140 = &this->m_descriptorSetLayout;
  local_110 = &this->m_descriptorSet;
  memset(local_f8,0,0xa8);
  context_00 = this->m_context;
  vki = context_00->m_vki;
  vk = context_00->m_vk;
  device = context_00->m_device;
  physDevice = context_00->m_physicalDevice;
  allocator = context_00->m_allocator;
  requireFeaturesForSSBOAccess(context_00,this->m_stage);
  VVar2 = (this->m_resource->m_imageData).format;
  uVar14 = VVar2 - VK_FORMAT_R16_UINT;
  if (((uVar14 < 0x1e) && ((0x3806039fU >> (uVar14 & 0x1f) & 1) != 0)) ||
     ((uVar14 = VVar2 - VK_FORMAT_R8_UNORM, uVar14 < 0x3f &&
      ((0x60000000000019b3U >> ((ulong)uVar14 & 0x3f) & 1) != 0)))) {
    requireFeatures(vki,physDevice,0x40);
  }
  this_02 = (Buffer *)operator_new(0x30);
  this_00 = local_78;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_e8,this->m_hostBufferSizeBytes,3);
  synchronization::Buffer::Buffer
            (this_02,vk,device,allocator,(VkBufferCreateInfo *)local_e8,(MemoryRequirement)0x1);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  if ((this_00->
      super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
      ).m_data.ptr != this_02) {
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset(&this_00->
           super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
         );
    (this_00->
    super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
    ).m_data.ptr = this_02;
  }
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::reset
            ((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_168);
  __n = this->m_hostBufferSizeBytes;
  pAVar4 = (((this->m_hostBuffer).
             super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             .m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  pvVar5 = pAVar4->m_hostPtr;
  if (this->m_mode == ACCESS_MODE_READ) {
    memset(pvVar5,0,__n);
  }
  else if (__n != 0) {
    uVar19 = 0;
    do {
      *(undefined1 *)((long)pvVar5 + uVar19) =
           (&synchronization::(anonymous_namespace)::fillPattern(void*,unsigned_long)::pattern)
           [uVar19 % 0xb];
      uVar19 = uVar19 + 1;
    } while ((uVar19 & 0xffffffff) < __n);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar4->m_memory).m_internal,pAVar4->m_offset,
             this->m_hostBufferSizeBytes);
  this_01 = local_70;
  pIVar15 = (Image *)operator_new(0x30);
  pRVar6 = this->m_resource;
  makeImageCreateInfo((VkImageCreateInfo *)local_e8,(pRVar6->m_imageData).imageType,
                      &(pRVar6->m_imageData).extent,(pRVar6->m_imageData).format,0xb);
  synchronization::Image::Image
            (pIVar15,vk,device,allocator,(VkImageCreateInfo *)local_e8,(MemoryRequirement)0x0);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  if ((this_01->
      super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
      ).m_data.ptr != pIVar15) {
    de::details::
    UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
              (&this_01->
                super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              );
    (this_01->
    super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>)
    .m_data.ptr = pIVar15;
  }
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::reset
            ((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              *)&local_168);
  if (this->m_mode == ACCESS_MODE_READ) {
    pIVar15 = (this->m_image).
              super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
              .m_data.ptr;
    this->m_srcImage = &(this->m_resource->m_imageData).handle;
  }
  else {
    this->m_srcImage =
         (VkImage *)
         (this->m_image).
         super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
         .m_data.ptr;
    pIVar15 = (Image *)&this->m_resource->m_imageData;
  }
  this->m_dstImage = (VkImage *)pIVar15;
  pRVar6 = this->m_resource;
  VVar3 = (pRVar6->m_imageData).imageType;
  viewType = 7;
  if (VVar3 < VK_IMAGE_TYPE_LAST) {
    viewType = VVar3;
  }
  local_38 = (pRVar6->m_imageData).subresourceRange.layerCount;
  pVVar1 = &(pRVar6->m_imageData).subresourceRange;
  local_48._0_4_ = pVVar1->aspectMask;
  local_48._4_4_ = pVVar1->baseMipLevel;
  uStack_40._0_4_ = (pRVar6->m_imageData).subresourceRange.levelCount;
  uStack_40._4_4_ = (pRVar6->m_imageData).subresourceRange.baseArrayLayer;
  makeImageView(&local_168,vk,device,(VkImage)this->m_srcImage->m_internal,viewType,
                (pRVar6->m_imageData).format,*pVVar1);
  stack0xffffffffffffff28 =
       (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  uStack_d0 = (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar7.m_internal =
       (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar7.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_srcImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
               ,VVar7);
  }
  (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
       (VkDevice)stack0xffffffffffffff28;
  (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)uStack_d0;
  (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       local_e8._0_8_;
  (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_e8._8_8_;
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  pRVar6 = this->m_resource;
  local_58 = (pRVar6->m_imageData).subresourceRange.layerCount;
  pVVar1 = &(pRVar6->m_imageData).subresourceRange;
  local_68._0_4_ = pVVar1->aspectMask;
  local_68._4_4_ = pVVar1->baseMipLevel;
  uStack_60._0_4_ = (pRVar6->m_imageData).subresourceRange.levelCount;
  uStack_60._4_4_ = (pRVar6->m_imageData).subresourceRange.baseArrayLayer;
  makeImageView(&local_168,vk,device,(VkImage)this->m_dstImage->m_internal,viewType,
                (pRVar6->m_imageData).format,*pVVar1);
  stack0xffffffffffffff28 =
       (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  uStack_d0 = (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  VVar7.m_internal =
       (local_100->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (VVar7.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_dstImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
               ,VVar7);
  }
  (local_100->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
       (VkDevice)stack0xffffffffffffff28;
  (local_100->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)uStack_d0;
  (local_100->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       local_e8._0_8_;
  (local_100->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_e8._8_8_;
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_e8);
  pDVar16 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)local_e8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,
                       this->m_stage,(VkSampler *)0x0);
  pDVar16 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar16,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,this->m_stage,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&local_138,pDVar16,vk,device,0);
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal =
       (local_140->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                deleter,obj);
  }
  (local_140->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  (local_140->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  (local_140->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  (local_140->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.deleter.m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  if (local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  }
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (uStack_d0 != (pointer)0x0) {
    operator_delete(uStack_d0,(long)local_c0 - (long)uStack_d0);
  }
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,(long)stack0xffffffffffffff28 - local_e8._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_138);
  pDVar17 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_138,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  pDVar17 = ::vk::DescriptorPoolBuilder::addType(pDVar17,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_168,pDVar17,vk,device,1,1);
  stack0xffffffffffffff28 =
       (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device;
  uStack_d0 = (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (local_108->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj_00);
  }
  (local_108->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_device =
       (VkDevice)stack0xffffffffffffff28;
  (local_108->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)uStack_d0;
  (local_108->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       local_e8._0_8_;
  (local_108->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_e8._8_8_;
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)
               &local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkDescriptorPool)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((void *)local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      (void *)0x0) {
    operator_delete((void *)local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                            m_internal,
                    (long)local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                          m_device -
                    local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                    m_internal);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_168,vk,device,
                    (VkDescriptorPool)
                    (local_108->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                    m_internal,
                    (VkDescriptorSetLayout)
                    (local_140->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                    m_internal);
  local_e8._16_4_ =
       SUB84(local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device,0);
  VStack_d4 = local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device._4_4_
  ;
  uStack_d0 = (pointer)local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_allocator;
  local_e8._0_8_ = local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
  ;
  local_e8._8_8_ =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pvVar5 = (void *)(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.
                   m_internal;
  if (pvVar5 != (void *)0x0) {
    pDVar8 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
         (deUint64)pvVar5;
    (*pDVar8->_vptr_DeviceInterface[0x3d])
              (pDVar8,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal);
  }
  *(undefined4 *)
   &(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
       local_e8._16_4_;
  *(VkImageType *)
   ((long)&(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device + 4)
       = VStack_d4;
  *(VkFormat *)
   &(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
       (VkFormat)uStack_d0;
  *(deUint32 *)
   ((long)&(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.
           m_internal + 4) = uStack_d0._4_4_;
  *(undefined4 *)
   &(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       local_e8._0_4_;
  *(undefined4 *)
   ((long)&(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal + 4)
       = local_e8._4_4_;
  *(undefined4 *)
   &(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
       local_e8._8_4_;
  *(undefined4 *)
   ((long)&(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface
   + 4) = local_e8._12_4_;
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    local_e8._0_8_ =
         local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    (*(local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
               ,local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device,
               local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator);
  }
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_f8->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(local_168.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device.
                _4_4_,1);
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       (local_100->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0;
  local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       (VkDevice)
       CONCAT44(local_138.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device.
                _4_4_,1);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_e8);
  pMVar11 = local_110;
  pDVar18 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)local_e8,
                       (int)(local_110->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.
                            object.m_internal,(void *)0x0,0);
  pDVar18 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (pDVar18,(int)(pMVar11->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data
                                    .object.m_internal,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk,device);
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  if (uStack_d0 != (pointer)0x0) {
    operator_delete(uStack_d0,(long)local_c0 - (long)uStack_d0);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)local_e8);
  pMVar10 = local_140;
  if (pipelineType == PIPELINE_TYPE_GRAPHICS) {
    this_03 = (GraphicsPipeline *)operator_new(0x120);
    GraphicsPipeline::GraphicsPipeline
              (this_03,local_88,local_ec,local_80,
               (VkDescriptorSetLayout)
               (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal);
  }
  else {
    this_03 = (GraphicsPipeline *)operator_new(0x60);
    ComputePipeline::ComputePipeline
              ((ComputePipeline *)this_03,local_88,this->m_dispatchCall,local_80,
               (VkDescriptorSetLayout)
               (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
               object.m_internal);
  }
  pGVar9 = (GraphicsPipeline *)
           (this->m_pipeline).
           super_UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
           .m_data.ptr;
  if (pGVar9 != this_03) {
    if (pGVar9 != (GraphicsPipeline *)0x0) {
      (*(pGVar9->super_Pipeline)._vptr_Pipeline[1])();
      (this->m_pipeline).
      super_UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
      .m_data.ptr = (Pipeline *)0x0;
    }
    (this->m_pipeline).
    super_UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
    .m_data.ptr = &this_03->super_Pipeline;
  }
  return;
}

Assistant:

ImageImplementation (OperationContext&				context,
						 Resource&						resource,
						 const VkShaderStageFlagBits	stage,
						 const std::string&				shaderPrefix,
						 const AccessMode				mode,
						 const PipelineType				pipelineType,
						 const DispatchCall				dispatchCall)
		: m_context				(context)
		, m_resource			(resource)
		, m_stage				(stage)
		, m_pipelineStage		(pipelineStageFlagsFromShaderStageFlagBits(m_stage))
		, m_mode				(mode)
		, m_dispatchCall		(dispatchCall)
		, m_hostBufferSizeBytes	(getPixelBufferSize(m_resource.getImage().format, m_resource.getImage().extent))
	{
		const DeviceInterface&		vk			= m_context.getDeviceInterface();
		const InstanceInterface&	vki			= m_context.getInstanceInterface();
		const VkDevice				device		= m_context.getDevice();
		const VkPhysicalDevice		physDevice	= m_context.getPhysicalDevice();
		Allocator&					allocator	= m_context.getAllocator();

		// Image stores are always required, in either access mode.
		requireFeaturesForSSBOAccess(m_context, m_stage);

		// Some storage image formats require additional capability.
		if (isStorageImageExtendedFormat(m_resource.getImage().format))
			requireFeatures(vki, physDevice, FEATURE_SHADER_STORAGE_IMAGE_EXTENDED_FORMATS);

		m_hostBuffer = de::MovePtr<Buffer>(new Buffer(
			vk, device, allocator, makeBufferCreateInfo(m_hostBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT),
			MemoryRequirement::HostVisible));

		// Init host buffer data
		{
			const Allocation& alloc = m_hostBuffer->getAllocation();
			if (m_mode == ACCESS_MODE_READ)
				deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(m_hostBufferSizeBytes));
			else
				fillPattern(alloc.getHostPtr(), m_hostBufferSizeBytes);
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_hostBufferSizeBytes);
		}

		// Image resources
		{
			m_image = de::MovePtr<Image>(new Image(vk, device, allocator,
				makeImageCreateInfo(m_resource.getImage().imageType, m_resource.getImage().extent, m_resource.getImage().format,
									VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_STORAGE_BIT),
				MemoryRequirement::Any));

			if (m_mode == ACCESS_MODE_READ)
			{
				m_srcImage = &m_resource.getImage().handle;
				m_dstImage = &(**m_image);
			}
			else
			{
				m_srcImage = &(**m_image);
				m_dstImage = &m_resource.getImage().handle;
			}

			const VkImageViewType viewType = getImageViewType(m_resource.getImage().imageType);

			m_srcImageView	= makeImageView(vk, device, *m_srcImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
			m_dstImageView	= makeImageView(vk, device, *m_dstImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
		}

		// Prepare descriptors
		{
			m_descriptorSetLayout = DescriptorSetLayoutBuilder()
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.build(vk, device);

			m_descriptorPool = DescriptorPoolBuilder()
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

			m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

			const VkDescriptorImageInfo srcImageInfo = makeDescriptorImageInfo(DE_NULL, *m_srcImageView, VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo dstImageInfo = makeDescriptorImageInfo(DE_NULL, *m_dstImageView, VK_IMAGE_LAYOUT_GENERAL);

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &srcImageInfo)
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &dstImageInfo)
				.update(vk, device);
		}

		// Create pipeline
		m_pipeline = (pipelineType == PIPELINE_TYPE_GRAPHICS ? de::MovePtr<Pipeline>(new GraphicsPipeline(context, stage, shaderPrefix, *m_descriptorSetLayout))
															 : de::MovePtr<Pipeline>(new ComputePipeline(context, m_dispatchCall, shaderPrefix, *m_descriptorSetLayout)));
	}